

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

Node * __thiscall spoa::Graph::Node::Successor(Node *this,uint32_t label)

{
  bool bVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60;
  uint *local_58;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_48;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> jt;
  Edge **it;
  const_iterator __end1;
  const_iterator __begin1;
  vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_> *__range1;
  Node *pNStack_18;
  uint32_t label_local;
  Node *this_local;
  
  __range1._4_4_ = label;
  pNStack_18 = this;
  __end1 = std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::begin
                     (&this->outedges);
  it = (Edge **)std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>::end
                          (&this->outedges);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                                *)&it);
    if (!bVar1) {
      return (Node *)0x0;
    }
    jt._M_current =
         (uint *)__gnu_cxx::
                 __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
                 ::operator*(&__end1);
    local_50._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           (&(*(Edge **)jt._M_current)->labels);
    local_58 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  (*(long *)jt._M_current + 0x10));
    local_48 = std::
               find<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                         (local_50,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                    )local_58,(uint *)((long)&__range1 + 4));
    local_60._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            (*(long *)jt._M_current + 0x10));
    bVar1 = __gnu_cxx::operator!=(&local_48,&local_60);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<spoa::Graph::Edge_*const_*,_std::vector<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>_>
    ::operator++(&__end1);
  }
  return *(Node **)(*(long *)jt._M_current + 8);
}

Assistant:

Graph::Node* Graph::Node::Successor(std::uint32_t label) const {
  for (const auto& it : outedges) {
    auto jt = std::find(it->labels.begin(), it->labels.end(), label);
    if (jt != it->labels.end()) {
      return it->head;
    }
  }
  return nullptr;
}